

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

bool __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator==
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *o)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar1 = (long)this->_cursor - (long)this->_stack;
  if (lVar1 == (long)o->_cursor - (long)o->_stack) {
    bVar3 = this->_cursor == this->_stack;
    if (!bVar3) {
      lVar2 = (lVar1 >> 4) * -0x5555555555555555;
      lVar1 = 0;
      do {
        if ((*(int *)((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                               *)(&this->_stack->numeral + 1))->_id + lVar1) !=
             *(int *)((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                               *)(&o->_stack->numeral + 1))->_id + lVar1)) ||
           (bVar3 = Kernel::RationalConstantType::operator==
                              ((RationalConstantType *)
                               ((long)&(this->_stack->numeral).super_RationalConstantType._num._val
                                       [0]._mp_alloc + lVar1),
                               (RationalConstantType *)
                               ((long)&(o->_stack->numeral).super_RationalConstantType._num._val[0].
                                       _mp_alloc + lVar1)), !bVar3)) goto LAB_002ef5c1;
        lVar1 = lVar1 + 0x30;
        lVar2 = lVar2 + -1;
        bVar3 = lVar2 == 0;
      } while (!bVar3);
    }
  }
  else {
LAB_002ef5c1:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const Stack& o) const
  {
    if(size()!=o.size()) {
      return false;
    }
    size_t sz = size();
    for(size_t i=0; i!=sz; ++i) {
      if((*this)[i]!=o[i]) {
	return false;
      }
    }
    return true;
  }